

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QString * makeString(QCborContainerPrivate *d,qsizetype idx,ConversionMode mode)

{
  Type TVar1;
  const_reference pEVar2;
  int in_ECX;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  Element *e;
  char16_t *str;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str_3;
  undefined4 in_stack_fffffffffffffe88;
  DiagnosticNotationOption in_stack_fffffffffffffe8c;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  QFlagsStorage<QCborValue::DiagnosticNotationOption> opts;
  qsizetype in_stack_fffffffffffffea0;
  QCborContainerPrivate *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  double in_stack_fffffffffffffeb8;
  QCborContainerPrivate *in_stack_fffffffffffffec0;
  QCborContainerPrivate *d_00;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_8c;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40 [2];
  long local_8;
  
  opts.i = (Int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_00 = in_RDI;
  pEVar2 = QList<QtCbor::Element>::at
                     ((QList<QtCbor::Element> *)in_stack_fffffffffffffe90,
                      CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  TVar1 = pEVar2->type;
  if (TVar1 == Invalid) {
    QString::QString((QString *)0x4898b0);
    goto LAB_0048991a;
  }
  if (TVar1 == Integer) {
    QString::number((qlonglong)in_stack_fffffffffffffea8,
                    (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    goto LAB_0048991a;
  }
  if (TVar1 == ByteArray) {
    if (in_ECX == 1) {
      QCborContainerPrivate::stringAt(in_RDI,(qsizetype)in_stack_fffffffffffffec0);
    }
    else {
      encodeByteArray(d_00,(qsizetype)in_RDI,(QCborTag)in_stack_fffffffffffffec0);
    }
    goto LAB_0048991a;
  }
  if (TVar1 == String) {
    QCborContainerPrivate::stringAt(in_RDI,(qsizetype)in_stack_fffffffffffffec0);
    goto LAB_0048991a;
  }
  if ((TVar1 == Array) || (TVar1 == Map)) {
    QCborContainerPrivate::valueAt(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    QFlags<QCborValue::DiagnosticNotationOption>::QFlags
              ((QFlags<QCborValue::DiagnosticNotationOption> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe8c);
    QCborValue::toDiagnosticNotation
              ((QCborValue *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (DiagnosticNotationOptions)opts.i);
    QCborValue::~QCborValue((QCborValue *)in_stack_fffffffffffffe90);
    goto LAB_0048991a;
  }
  if (TVar1 == Tag) {
LAB_004898b2:
    local_8c.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorage<QtCbor::Element::ValueFlag>)
         QFlags<QtCbor::Element::ValueFlag>::operator&
                   ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_fffffffffffffe90,
                    in_stack_fffffffffffffe8c);
    QFlags::operator_cast_to_bool((QFlags *)&local_8c);
    encodeTag(in_stack_fffffffffffffec0);
  }
  else {
    if (TVar1 != SimpleType) {
      if (TVar1 == False) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_40,(Data *)0x0,L"false",5);
        QString::QString((QString *)in_stack_fffffffffffffe90,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe90);
        goto LAB_0048991a;
      }
      if (TVar1 == True) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_58,(Data *)0x0,L"true",4);
        QString::QString((QString *)in_stack_fffffffffffffe90,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe90);
        goto LAB_0048991a;
      }
      if (TVar1 == Null) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_70,(Data *)0x0,L"null",4);
        QString::QString((QString *)in_stack_fffffffffffffe90,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe90);
        goto LAB_0048991a;
      }
      if (TVar1 == Undefined) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_88,(Data *)0x0,L"undefined",9);
        QString::QString((QString *)in_stack_fffffffffffffe90,
                         (DataPointer *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe90);
        goto LAB_0048991a;
      }
      if (TVar1 == Double) {
        QtCbor::Element::fpvalue((Element *)in_stack_fffffffffffffe90);
        QString::number(in_stack_fffffffffffffeb8,(char)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
                        (int)in_stack_fffffffffffffeb0);
        goto LAB_0048991a;
      }
      if ((((TVar1 == DateTime) || (TVar1 == Url)) || (TVar1 == RegularExpression)) ||
         (TVar1 == Uuid)) goto LAB_004898b2;
    }
    simpleTypeString((Type)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  }
LAB_0048991a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)d_00;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static QString makeString(const QCborContainerPrivate *d, qsizetype idx,
                                         ConversionMode mode)
{
    const auto &e = d->elements.at(idx);

    switch (e.type) {
    case QCborValue::Integer:
        return QString::number(qint64(e.value));

    case QCborValue::Double:
        return QString::number(e.fpvalue());

    case QCborValue::ByteArray:
        return mode == ConversionMode::FromVariantToJson
                ? d->stringAt(idx)
                : encodeByteArray(d, idx, QCborTag(QCborKnownTags::ExpectedBase64url));

    case QCborValue::String:
        return d->stringAt(idx);

    case QCborValue::Array:
    case QCborValue::Map:
#if defined(QT_BOOTSTRAPPED)
        Q_UNREACHABLE_RETURN(QString());
#else
        return d->valueAt(idx).toDiagnosticNotation(QCborValue::Compact);
#endif

    case QCborValue::SimpleType:
        break;

    case QCborValue::False:
        return QStringLiteral("false");

    case QCborValue::True:
        return QStringLiteral("true");

    case QCborValue::Null:
        return QStringLiteral("null");

    case QCborValue::Undefined:
        return QStringLiteral("undefined");

    case QCborValue::Invalid:
        return QString();

    case QCborValue::Tag:
    case QCborValue::DateTime:
    case QCborValue::Url:
    case QCborValue::RegularExpression:
    case QCborValue::Uuid:
        return encodeTag(e.flags & Element::IsContainer ? e.container : nullptr);
    }

    // maybe it's a simple type
    return simpleTypeString(e.type);
}